

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslationalOrderParamZ.cpp
# Opt level: O2

void __thiscall
OpenMD::TranslationalOrderParamZ::collectHistogram
          (TranslationalOrderParamZ *this,StuntDouble *sd1,StuntDouble *sd2)

{
  int *piVar1;
  double dVar2;
  char cVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Vector3d r12;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> local_88;
  Vector<double,_3U> local_70;
  Vector<double,_3U> local_58;
  Vector<double,_3U> local_40;
  
  if (sd1 != sd2) {
    cVar3 = (((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->simParams_->
            UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
    dVar2 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
    StuntDouble::getPos((Vector3d *)&local_58,sd1);
    StuntDouble::getPos((Vector3d *)&local_70,sd2);
    operator-(&local_40,&local_70,&local_58);
    Vector<double,_3U>::Vector(&local_88,&local_40);
    if (cVar3 == '\x01') {
      Snapshot::wrapVector((this->super_RadialDistrFunc).currentSnapshot_,(Vector3d *)&local_88);
      Snapshot::wrapVector((this->super_RadialDistrFunc).currentSnapshot_,(Vector3d *)&local_58);
      Snapshot::wrapVector((this->super_RadialDistrFunc).currentSnapshot_,(Vector3d *)&local_70);
    }
    dVar5 = Vector<double,_3U>::length(&local_88);
    if (dVar5 < this->len_) {
      lVar4 = *(long *)&(this->histogram_).
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)(dVar5 / this->deltaR_)].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      auVar6._0_8_ = (double)this->nZBins_ * (dVar2 * 0.5 + local_58.data_[(uint)this->axis_]);
      auVar6._8_8_ = (double)this->nZBins_ * (dVar2 * 0.5 + local_70.data_[(uint)this->axis_]);
      auVar7._8_8_ = dVar2;
      auVar7._0_8_ = dVar2;
      auVar7 = divpd(auVar6,auVar7);
      piVar1 = (int *)(lVar4 + (long)(int)auVar7._0_8_ * 4);
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)(lVar4 + (long)(int)auVar7._8_8_ * 4);
      *piVar1 = *piVar1 + 1;
    }
  }
  return;
}

Assistant:

void TranslationalOrderParamZ::collectHistogram(StuntDouble* sd1,
                                                  StuntDouble* sd2) {
    if (sd1 == sd2) { return; }

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();
    RealType boxZ = zBox_.back();

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos2 - pos1;
    if (usePeriodicBoundaryConditions_) {
      currentSnapshot_->wrapVector(r12);
      currentSnapshot_->wrapVector(pos1);
      currentSnapshot_->wrapVector(pos2);
    }

    RealType distance = r12.length();

    if (distance < len_) {
      int whichBin = int(distance / deltaR_);
      int zBin1    = int(nZBins_ * (0.5 * boxZ + pos1[axis_]) / boxZ);
      int zBin2    = int(nZBins_ * (0.5 * boxZ + pos2[axis_]) / boxZ);

      histogram_[whichBin][zBin1] += 1;
      histogram_[whichBin][zBin2] += 1;
    }
  }